

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TIntermediate::foldSwizzle
          (TIntermediate *this,TIntermTyped *node,TSwizzleSelectors<int> *selectors,TSourceLoc *loc)

{
  TConstUnionVector *this_00;
  int iVar1;
  int iVar2;
  TBasicType t;
  undefined4 extraout_var;
  TConstUnion *pTVar3;
  TConstUnion *pTVar4;
  undefined4 extraout_var_00;
  TIntermConstantUnion *pTVar5;
  TType local_e8;
  TIntermConstantUnion *local_50;
  TIntermTyped *result;
  undefined1 local_40 [4];
  int i;
  TConstUnionArray constArray;
  TConstUnionArray *unionArray;
  TSourceLoc *loc_local;
  TSwizzleSelectors<int> *selectors_local;
  TIntermTyped *node_local;
  TIntermediate *this_local;
  
  iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])();
  constArray.unionArray =
       (TConstUnionVector *)
       TIntermConstantUnion::getConstArray((TIntermConstantUnion *)CONCAT44(extraout_var,iVar1));
  iVar1 = TSwizzleSelectors<int>::size(selectors);
  TConstUnionArray::TConstUnionArray((TConstUnionArray *)local_40,iVar1);
  for (result._4_4_ = 0; iVar1 = result._4_4_, iVar2 = TSwizzleSelectors<int>::size(selectors),
      this_00 = constArray.unionArray, iVar1 < iVar2; result._4_4_ = result._4_4_ + 1) {
    iVar1 = TSwizzleSelectors<int>::operator[](selectors,result._4_4_);
    pTVar3 = TConstUnionArray::operator[]((TConstUnionArray *)this_00,(long)iVar1);
    pTVar4 = TConstUnionArray::operator[]((TConstUnionArray *)local_40,(long)result._4_4_);
    pTVar4->field_0 = pTVar3->field_0;
    pTVar4->type = pTVar3->type;
  }
  iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  pTVar5 = addConstantUnion(this,(TConstUnionArray *)local_40,
                            (TType *)CONCAT44(extraout_var_00,iVar1),loc,false);
  local_50 = (TIntermConstantUnion *)node;
  if (pTVar5 != (TIntermConstantUnion *)0x0) {
    local_50 = pTVar5;
    t = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
    iVar1 = TSwizzleSelectors<int>::size(selectors);
    TType::TType(&local_e8,t,EvqConst,iVar1,0,0,false);
    (*(pTVar5->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])(pTVar5,&local_e8);
    TType::~TType(&local_e8);
  }
  pTVar5 = local_50;
  TConstUnionArray::~TConstUnionArray((TConstUnionArray *)local_40);
  return &pTVar5->super_TIntermTyped;
}

Assistant:

TIntermTyped* TIntermediate::foldSwizzle(TIntermTyped* node, TSwizzleSelectors<TVectorSelector>& selectors, const TSourceLoc& loc)
{
    const TConstUnionArray& unionArray = node->getAsConstantUnion()->getConstArray();
    TConstUnionArray constArray(selectors.size());

    for (int i = 0; i < selectors.size(); i++)
        constArray[i] = unionArray[selectors[i]];

    TIntermTyped* result = addConstantUnion(constArray, node->getType(), loc);

    if (result == nullptr)
        result = node;
    else
        result->setType(TType(node->getBasicType(), EvqConst, selectors.size()));

    return result;
}